

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

void __thiscall cmCTest::GenerateSubprojectsOutput(cmCTest *this,cmXMLWriter *xml)

{
  pointer value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subprojects;
  allocator local_69;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  GetLabelsForSubprojects_abi_cxx11_(&local_68,this);
  for (value = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      value != local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; value = value + 1) {
    std::__cxx11::string::string((string *)&local_50,"Subproject",&local_69);
    cmXMLWriter::StartElement(xml,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"name",value);
    std::__cxx11::string::string((string *)&local_50,"Label",&local_69);
    cmXMLWriter::Element<std::__cxx11::string>(xml,&local_50,value);
    std::__cxx11::string::~string((string *)&local_50);
    cmXMLWriter::EndElement(xml);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void cmCTest::GenerateSubprojectsOutput(cmXMLWriter& xml)
{
  std::vector<std::string> subprojects = this->GetLabelsForSubprojects();
  std::vector<std::string>::const_iterator i;
  for (i = subprojects.begin(); i != subprojects.end(); ++i) {
    xml.StartElement("Subproject");
    xml.Attribute("name", *i);
    xml.Element("Label", *i);
    xml.EndElement(); // Subproject
  }
}